

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

void __thiscall soplex::SPxBasisBase<double>::loadDesc(SPxBasisBase<double> *this,Desc *ds)

{
  double dVar1;
  Status *pSVar2;
  SPxId *pSVar3;
  Status SVar4;
  SPxOut *pSVar5;
  SVectorBase<double> *pSVar6;
  double *pdVar7;
  SPxSolverBase<double> *pSVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  Verbosity old_verbosity;
  int iStack_3c;
  undefined4 local_34;
  
  pSVar5 = this->spxout;
  if ((pSVar5 != (SPxOut *)0x0) && (4 < (int)pSVar5->m_verbosity)) {
    old_verbosity = pSVar5->m_verbosity;
    local_34 = 5;
    (*pSVar5->_vptr_SPxOut[2])();
    pSVar5 = soplex::operator<<(this->spxout,"IBASIS02 loading of Basis invalidates factorization");
    std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&old_verbosity);
  }
  (this->lastin).super_DataKey = (DataKey)0xffffffff00000000;
  (this->lastout).super_DataKey = (DataKey)0xffffffff00000000;
  this->lastidx = -1;
  this->iterCount = 0;
  this->updateCount = 0;
  if (&this->thedesc != ds) {
    Desc::operator=(&this->thedesc,ds);
    setRep(this);
  }
  this->nzCount = 0;
  lVar11 = 0;
  iVar9 = 0;
  while( true ) {
    pSVar8 = this->theLP;
    lVar10 = (long)(pSVar8->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
    if (lVar10 <= lVar11) break;
    pSVar2 = (this->thedesc).rowstat.data;
    if (pSVar2[lVar11] < ~P_FREE) {
      dVar1 = (pSVar8->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      pdVar7 = (pSVar8->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + lVar11;
      if ((dVar1 != *pdVar7) || (NAN(dVar1) || NAN(*pdVar7))) {
        pdVar7 = (double *)infinity();
        pSVar8 = this->theLP;
        if (-*pdVar7 < dVar1) {
          dVar1 = (pSVar8->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar11];
          pdVar7 = (double *)infinity();
          pSVar2 = (this->thedesc).rowstat.data;
          if ((*pdVar7 <= dVar1) || (SVar4 = pSVar2[lVar11], SVar4 == P_ON_LOWER)) {
LAB_001926ab:
            pSVar2[lVar11] = P_ON_LOWER;
            SVar4 = P_ON_LOWER;
            goto LAB_001926bf;
          }
          if (SVar4 == P_ON_UPPER) {
            pSVar8 = this->theLP;
          }
          else {
            pSVar8 = this->theLP;
            if ((pSVar8->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar11] <= 0.0) goto LAB_001926ab;
          }
        }
        dVar1 = (pSVar8->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar11];
        pdVar7 = (double *)infinity();
        pSVar2 = (this->thedesc).rowstat.data;
        if (*pdVar7 <= dVar1) {
          pSVar2[lVar11] = P_FREE;
          SVar4 = P_FREE;
        }
        else {
          pSVar2[lVar11] = P_ON_UPPER;
          SVar4 = P_ON_UPPER;
        }
      }
      else {
        pSVar2[lVar11] = P_FIXED;
        SVar4 = P_FIXED;
      }
    }
    else {
      SVar4 = dualRowStatus(this,(int)lVar11);
      (this->thedesc).rowstat.data[lVar11] = SVar4;
    }
LAB_001926bf:
    pSVar8 = this->theLP;
    if (0 < SVar4 * pSVar8->theRep) {
      if (iVar9 == (this->matrix).thesize) break;
      _old_verbosity = (DataKey)SPxLPBase<double>::rId(&pSVar8->super_SPxLPBase<double>,(int)lVar11)
      ;
      pSVar3 = (this->theBaseId).data;
      pSVar3[iVar9].super_DataKey = _old_verbosity;
      pSVar3[iVar9].super_DataKey.info = -1;
      pSVar6 = SPxSolverBase<double>::vector(this->theLP,(SPxRowId *)&old_verbosity);
      (this->matrix).data[iVar9] = pSVar6;
      this->nzCount = this->nzCount + (this->matrix).data[iVar9]->memused;
      iVar9 = iVar9 + 1;
    }
    lVar11 = lVar11 + 1;
  }
  for (lVar12 = 0;
      lVar12 < (pSVar8->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
               set.thenum; lVar12 = lVar12 + 1) {
    pSVar2 = (this->thedesc).colstat.data;
    if (pSVar2[lVar12] < ~P_FREE) {
      dVar1 = (pSVar8->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar12];
      pdVar7 = (pSVar8->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + lVar12;
      if ((dVar1 != *pdVar7) || (NAN(dVar1) || NAN(*pdVar7))) {
        pdVar7 = (double *)infinity();
        pSVar8 = this->theLP;
        if (-*pdVar7 < dVar1) {
          dVar1 = (pSVar8->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar12];
          pdVar7 = (double *)infinity();
          pSVar2 = (this->thedesc).colstat.data;
          if ((*pdVar7 <= dVar1) || (SVar4 = pSVar2[lVar12], SVar4 == P_ON_LOWER)) {
LAB_0019289f:
            pSVar2[lVar12] = P_ON_LOWER;
            SVar4 = P_ON_LOWER;
            goto LAB_00192781;
          }
          if (SVar4 == P_ON_UPPER) {
            pSVar8 = this->theLP;
          }
          else {
            pSVar8 = this->theLP;
            if ((pSVar8->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar12] <= 0.0) goto LAB_0019289f;
          }
        }
        dVar1 = (pSVar8->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar12];
        pdVar7 = (double *)infinity();
        pSVar2 = (this->thedesc).colstat.data;
        if (*pdVar7 <= dVar1) {
          pSVar2[lVar12] = P_FREE;
          SVar4 = P_FREE;
        }
        else {
          pSVar2[lVar12] = P_ON_UPPER;
          SVar4 = P_ON_UPPER;
        }
      }
      else {
        pSVar2[lVar12] = P_FIXED;
        SVar4 = P_FIXED;
      }
    }
    else {
      SVar4 = dualColStatus(this,(int)lVar12);
      (this->thedesc).colstat.data[lVar12] = SVar4;
    }
LAB_00192781:
    pSVar8 = this->theLP;
    if (0 < SVar4 * pSVar8->theRep) {
      if (iVar9 == (this->matrix).thesize) goto LAB_001928ca;
      _old_verbosity = (DataKey)SPxLPBase<double>::cId(&pSVar8->super_SPxLPBase<double>,(int)lVar12)
      ;
      pSVar3 = (this->theBaseId).data;
      pSVar3[iVar9].super_DataKey = _old_verbosity;
      pSVar3[iVar9].super_DataKey.info = 1;
      pSVar6 = SPxSolverBase<double>::vector(this->theLP,(SPxColId *)&old_verbosity);
      (this->matrix).data[iVar9] = pSVar6;
      this->nzCount = this->nzCount + (this->matrix).data[iVar9]->memused;
      pSVar8 = this->theLP;
      iVar9 = iVar9 + 1;
    }
  }
  if ((lVar11 < lVar10) || (iVar9 < (this->matrix).thesize)) {
LAB_001928ca:
    restoreInitialBasis(this);
  }
  else {
    this->matrixIsSetup = true;
  }
  this->factorized = false;
  if (this->factor != (SLinSolver<double> *)0x0) {
    (*this->factor->_vptr_SLinSolver[2])();
  }
  return;
}

Assistant:

void SPxBasisBase<R>::loadDesc(const Desc& ds)
{
   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);
   assert(ds.nRows() == theLP->nRows());
   assert(ds.nCols() == theLP->nCols());

   SPxId none;
   int   i;
   int   j;
   bool consistent = true;

   SPX_MSG_INFO3((*this->spxout),
                 (*this->spxout) << "IBASIS02 loading of Basis invalidates factorization"
                 << std::endl;)

   lastin      = none;
   lastout     = none;
   lastidx     = -1;
   iterCount   = 0;
   updateCount = 0;

   if(&ds != &thedesc)
   {
      thedesc = ds;
      setRep();
   }

   assert(theLP->dim() == matrix.size());

   nzCount = 0;

   for(j = i = 0; i < theLP->nRows(); ++i)
   {
      /* for columns and rows with D_... status, the correct D_... status depends on bounds and sides; if a basis
       * descriptor is loaded after changing bounds or sides, e.g. in the refine() method, we have to correct them
       */
      if(thedesc.rowStatus(i) >= 0)
         thedesc.rowStatus(i) = dualRowStatus(i);
      else if(theLP->SPxLPBase<R>::lhs(i) == theLP->SPxLPBase<R>::rhs(i))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lhs(i) > R(-infinity)
              && (theLP->SPxLPBase<R>::rhs(i) >= R(infinity)
                  || thedesc.rowStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || (thedesc.rowStatus(i) != SPxBasisBase<R>::Desc::P_ON_UPPER
                      && theLP->SPxLPBase<R>::maxRowObj(i) <= 0)))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      else if(theLP->SPxLPBase<R>::rhs(i) < R(infinity))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      else
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_FREE;

      if(theLP->isBasic(thedesc.rowStatus(i)))
      {
         assert(theLP->dim() == matrix.size());
         assert(j <= matrix.size());

         if(j == matrix.size())
         {
            // too many basic variables
            consistent = false;
            break;
         }

         SPxRowId id = theLP->SPxLPBase<R>::rId(i);
         theBaseId[j] = id;
         matrix[j] = &theLP->vector(id);
         nzCount += matrix[j++]->size();
      }
   }

   for(i = 0; i < theLP->nCols(); ++i)
   {
      /* for columns and rows with D_... status, the correct D_... status depends on bounds and sides; if a basis
       * descriptor is loaded after changing bounds or sides, e.g. in the refine() method, we have to correct them
       */
      if(thedesc.colStatus(i) >= 0)
         thedesc.colStatus(i) = dualColStatus(i);
      else if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lower(i) > R(-infinity)
              && (theLP->SPxLPBase<R>::upper(i) >= R(infinity)
                  || thedesc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || (thedesc.colStatus(i) != SPxBasisBase<R>::Desc::P_ON_UPPER
                      && theLP->SPxLPBase<R>::maxObj(i) <= 0)))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      else if(theLP->SPxLPBase<R>::upper(i) < R(infinity))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      else
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_FREE;

      if(theLP->isBasic(thedesc.colStatus(i)))
      {
         assert(theLP->dim() == matrix.size());
         assert(j <= matrix.size());

         if(j == matrix.size())
         {
            // too many basic variables
            consistent = false;
            break;
         }

         SPxColId id = theLP->SPxLPBase<R>::cId(i);
         theBaseId[j] = id;
         matrix[j] = &theLP->vector(id);
         nzCount += matrix[j++]->size();
      }
   }

   if(j < matrix.size())
      consistent = false;  // not enough basic variables

   /* if dimensions are inconsistent, restore slack basis
    * if dimensions are consistent, then we have setup a correct matrix
    */
   if(!consistent)
      restoreInitialBasis();
   else
      matrixIsSetup = true;

   assert(isDescValid(thedesc));

   factorized = false;

   if(factor != nullptr)
      factor->clear();
}